

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O1

void trico_compress(uint32_t *nr_of_compressed_bytes,uint8_t **out,float *input,
                   uint32_t number_of_floats,uint32_t hash1_size_exponent,
                   uint32_t hash2_size_exponent)

{
  float fVar1;
  uint8_t **ppuVar2;
  uint8_t *puVar3;
  void *pvVar4;
  uint32_t uVar5;
  int iVar6;
  float fVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  float fVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  uint32_t bcode [8];
  uint32_t xor1 [8];
  uint32_t xor2 [8];
  uint8_t *local_100;
  int local_f8;
  int local_f4;
  void *local_f0;
  void *local_e8;
  uint32_t *local_e0;
  uint8_t **local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  float *local_a0;
  uint32_t local_98 [8];
  uint32_t local_78;
  undefined1 auStack_74 [28];
  uint32_t local_58 [10];
  ulong uVar11;
  
  uVar10 = hash1_size_exponent & 0xfffffffe;
  if (0x1d < (hash1_size_exponent & 0xfffffffe)) {
    uVar10 = 0x1e;
  }
  uVar12 = hash2_size_exponent & 0xfffffffe;
  if (0x1d < (hash2_size_exponent & 0xfffffffe)) {
    uVar12 = 0x1e;
  }
  local_e0 = nr_of_compressed_bytes;
  local_a0 = input;
  puVar3 = (uint8_t *)
           malloc((ulong)((number_of_floats & 7) + number_of_floats * 4 +
                         (number_of_floats * 3 + 0x15 >> 3)));
  *out = puVar3;
  uVar14 = 1 << ((byte)uVar10 & 0x1f);
  uVar16 = 1 << ((byte)uVar12 & 0x1f);
  local_d8 = out;
  local_e8 = calloc((ulong)uVar14,4);
  pvVar4 = calloc((ulong)uVar16,4);
  local_a8 = (ulong)(uVar12 >> 1);
  *puVar3 = (char)(uVar12 >> 1) + (byte)uVar10 * '\b';
  puVar3[1] = (uint8_t)(number_of_floats >> 0x18);
  puVar3[2] = (uint8_t)(number_of_floats >> 0x10);
  puVar3[3] = (uint8_t)(number_of_floats >> 8);
  local_100 = puVar3 + 5;
  puVar3[4] = (uint8_t)number_of_floats;
  local_f0 = pvVar4;
  if (number_of_floats == 0) {
    uVar10 = 0;
  }
  else {
    local_c0 = (ulong)(uVar14 - 1);
    local_b8 = (ulong)(uVar16 - 1);
    local_f8 = 0x20 - uVar10;
    local_f4 = 0x20 - uVar12;
    local_c8 = (ulong)number_of_floats;
    lVar8 = 0;
    iVar6 = 0;
    fVar7 = 0.0;
    uVar17 = 0;
    uVar9 = 0;
    fVar15 = 0.0;
    local_b0 = (ulong)uVar10;
    do {
      uVar10 = (uint)lVar8 & 7;
      uVar11 = (ulong)uVar10;
      fVar1 = local_a0[lVar8];
      uVar14 = (uint)fVar1 ^ (uint)fVar7;
      *(float *)((long)local_e8 + uVar9 * 4) = fVar1;
      *(int *)((long)pvVar4 + uVar17 * 4) = (int)fVar1 - (int)fVar15;
      uVar13 = (ulong)(uVar10 * 4);
      *(uint *)((long)&local_78 + uVar13) = uVar14;
      uVar9 = (ulong)(((uint)fVar1 >> ((byte)local_f8 & 0x1f) ^
                      (int)uVar9 << ((byte)local_b0 & 0x1f)) & (uint)local_c0);
      uVar12 = iVar6 + (int)fVar15 ^ (uint)fVar1;
      *(uint *)((long)local_58 + uVar13) = uVar12;
      uVar17 = (ulong)(((uint)((int)fVar1 - (int)fVar15) >> ((byte)local_f4 & 0x1f) ^
                       (int)uVar17 << ((byte)local_a8 & 0x1f)) & (uint)local_b8);
      iVar6 = *(int *)((long)pvVar4 + uVar17 * 4);
      *(undefined4 *)((long)local_98 + uVar13) = 4;
      uVar5 = 0;
      bVar18 = fVar1 == fVar7;
      fVar7 = *(float *)((long)local_e8 + uVar9 * 4);
      if ((bVar18) || (uVar5 = 1, uVar14 < 0x100)) {
LAB_00109d5d:
        local_98[uVar11] = uVar5;
      }
      else {
        if (uVar14 < 0x10000) {
          uVar5 = (uint)(uVar12 < 0x100) * 3 + 2;
          goto LAB_00109d5d;
        }
        if (uVar14 < 0x1000000) {
          local_98[uVar11] = 3;
          uVar5 = 5;
          if ((uVar12 < 0x100) || (uVar5 = 6, uVar12 < 0x10000)) goto LAB_00109d5d;
        }
        else {
          uVar5 = 5;
          if (((uVar12 < 0x100) || (uVar5 = 6, uVar12 < 0x10000)) || (uVar5 = 7, uVar12 < 0x1000000)
             ) goto LAB_00109d5d;
        }
      }
      if (uVar10 == 7) {
        local_d0 = uVar11;
        trico_fill_code(&local_100,&local_78,local_58,local_98);
        uVar10 = (uint)local_d0;
        pvVar4 = local_f0;
      }
      lVar8 = lVar8 + 1;
      fVar15 = fVar1;
    } while ((int)local_c8 != (int)lVar8);
  }
  if (uVar10 != 7) {
    uVar9 = (ulong)uVar10;
    iVar6 = 6 - uVar10;
    if (6 < uVar10) {
      iVar6 = 0;
    }
    memset(auStack_74 + uVar9 * 4,0,(ulong)(iVar6 * 4 + 4));
    uVar12 = 6;
    if (6 < uVar10) {
      uVar12 = uVar10;
    }
    do {
      local_98[uVar9 + 1] = 1;
      uVar9 = uVar9 + 1;
    } while (uVar12 + 1 != uVar9);
    trico_fill_code(&local_100,&local_78,local_58,local_98);
  }
  ppuVar2 = local_d8;
  puVar3 = *local_d8;
  uVar10 = (int)local_100 - (int)puVar3;
  *local_e0 = uVar10;
  free(local_e8);
  free(local_f0);
  puVar3 = (uint8_t *)realloc(puVar3,(ulong)uVar10);
  *ppuVar2 = puVar3;
  return;
}

Assistant:

void trico_compress(uint32_t* nr_of_compressed_bytes, uint8_t** out, const float* input, const uint32_t number_of_floats, uint32_t hash1_size_exponent, uint32_t hash2_size_exponent)
  {
  hash1_size_exponent = (hash1_size_exponent >> 1) << 1;
  hash2_size_exponent = (hash2_size_exponent >> 1) << 1;
  if (hash1_size_exponent > 30)
    hash1_size_exponent = 30;
  if (hash2_size_exponent > 30)
    hash2_size_exponent = 30;

  uint32_t max_size = (number_of_floats) * sizeof(float) + 3 * (number_of_floats + 7) / 8 + (number_of_floats & 7); // theoretical maximum
  *out = (uint8_t*)trico_malloc(max_size);


  const uint32_t hash1_size = 1 << hash1_size_exponent;
  const uint32_t hash2_size = 1 << hash2_size_exponent;
  const uint32_t hash1_mask = hash1_size - 1;
  const uint32_t hash2_mask = hash2_size - 1;

  uint32_t* hash_table_1 = (uint32_t*)trico_calloc(hash1_size, 4);
  uint32_t* hash_table_2 = (uint32_t*)trico_calloc(hash2_size, 4);

  uint32_t value;
  uint32_t stride;
  uint32_t last_value = 0;
  uint32_t hash1 = 0;
  uint32_t hash2 = 0;
  uint32_t prediction1 = 0;
  uint32_t prediction2 = 0;
  uint32_t xor1[8];
  uint32_t xor2[8];
  uint32_t bcode[8];
  uint32_t j = 0;
  uint8_t* p_out = *out;

  uint8_t hash_info = (uint8_t)(((hash1_size_exponent >> 1) << 4) | (hash2_size_exponent >> 1));
  *p_out++ = hash_info;

  *p_out++ = (uint8_t)((number_of_floats >> 24));
  *p_out++ = (uint8_t)((number_of_floats >> 16) & 0xff);
  *p_out++ = (uint8_t)((number_of_floats >> 8) & 0xff);
  *p_out++ = (uint8_t)((number_of_floats) & 0xff);

  for (uint32_t i = 0; i < number_of_floats; ++i)
    {
    j = i & 7;
    value = *(const uint32_t*)(input++);

    xor1[j] = value ^ prediction1;
    hash_table_1[hash1] = value;
    hash1 = trico_compute_hash1_32(hash1, value, hash1_size_exponent, hash1_mask);
    prediction1 = hash_table_1[hash1];

    stride = value - last_value;
    xor2[j] = value ^ (last_value + prediction2);
    last_value = value;
    hash_table_2[hash2] = stride;
    hash2 = trico_compute_hash2_32(hash2, stride, hash2_size_exponent, hash2_mask);
    prediction2 = hash_table_2[hash2];


    bcode[j] = 4; // 4 bytes
    if (0 == xor1[j])
      {
      bcode[j] = 0; // 0 bytes
      }
    else if (0 == (xor1[j] >> 8))
      {
      bcode[j] = 1; // 1 byte
      }
    else if (0 == (xor1[j] >> 16))
      {
      bcode[j] = 2; // 2 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 5; // 1 byte
        }
      }
    else if (0 == (xor1[j] >> 24))
      {
      bcode[j] = 3; // 3 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 5; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 6; // 2 bytes
        }
      }
    else // 4 bytes
      {
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 5; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 6; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 7; // 3 bytes
        }
      }

    if (j == 7)
      {
      trico_fill_code(&p_out, xor1, xor2, bcode);
      }
    }
  for (uint32_t l = j + 1; l < 8; ++l)
    {
    bcode[l] = 1;
    xor1[l] = 0;
    }
  if (j != 7)
    {
    trico_fill_code(&p_out, xor1, xor2, bcode);
    }

  *nr_of_compressed_bytes = (uint32_t)(p_out - *out);
  trico_free(hash_table_1);
  trico_free(hash_table_2);
  *out = (uint8_t*)trico_realloc(*out, *nr_of_compressed_bytes);
  }